

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void check_input(uchar **from0,size_t n0)

{
  uchar *puVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  size_t sVar5;
  
  if (1 < n0) {
    sVar5 = 1;
    do {
      if (from0[sVar5 - 1] == (uchar *)0x0) goto LAB_0011ebcd;
      if (from0[sVar5] == (uchar *)0x0) goto LAB_0011ebec;
      iVar2 = strcmp((char *)from0[sVar5 - 1],(char *)from0[sVar5]);
      if (0 < iVar2) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Oops: \'\'",8);
        puVar1 = from0[sVar5 - 1];
        if (puVar1 == (uchar *)0x0) {
          std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
        }
        else {
          sVar4 = strlen((char *)puVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)puVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\' > \'\'",7);
        puVar1 = from0[sVar5];
        if (puVar1 == (uchar *)0x0) {
          std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
        }
        else {
          sVar4 = strlen((char *)puVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)puVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\'\n",3);
      }
      sVar5 = sVar5 + 1;
    } while (n0 != sVar5);
  }
  if (1 < n0) {
    sVar5 = 1;
    do {
      if (from0[sVar5 - 1] == (uchar *)0x0) {
LAB_0011ebcd:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      if (from0[sVar5] == (uchar *)0x0) {
LAB_0011ebec:
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar2 = strcmp((char *)from0[sVar5 - 1],(char *)from0[sVar5]);
      if (0 < iVar2) {
        __assert_fail("cmp(from0[i-1],from0[i])<=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x6c,"void check_input(unsigned char **, size_t)");
      }
      sVar5 = sVar5 + 1;
    } while (n0 != sVar5);
  }
  return;
}

Assistant:

static void
check_input(unsigned char** from0, size_t n0)
{
	(void) from0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
#endif
}